

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O0

void Extra_FileReaderFree(Extra_FileReader_t *p)

{
  Extra_FileReader_t *p_local;
  
  if (p->pFile != (FILE *)0x0) {
    fclose((FILE *)p->pFile);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  Vec_PtrFree(p->vTokens);
  Vec_IntFree(p->vLines);
  if (p != (Extra_FileReader_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Extra_FileReaderFree( Extra_FileReader_t * p )
{
    if ( p->pFile )
        fclose( p->pFile );
    ABC_FREE( p->pBuffer );
    Vec_PtrFree( p->vTokens );
    Vec_IntFree( p->vLines );
    ABC_FREE( p );
}